

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O0

double __thiscall FIR::filter(FIR *this,double x)

{
  int iVar1;
  FIR *in_RDI;
  double dVar2;
  double dVar3;
  int i_1;
  int i;
  int M;
  double output;
  int i_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  undefined8 local_18;
  
  local_18 = 0.0;
  iVar1 = getTaps(in_RDI);
  iVar4 = iVar1;
  while (iVar4 = iVar4 + -1, i_00 = (int)((ulong)in_RDI >> 0x20), 0 < iVar4) {
    getBuffer((FIR *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),i_00);
    setBuffer((FIR *)CONCAT44(iVar1,iVar4),
              (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),i_00);
  }
  setBuffer((FIR *)CONCAT44(iVar1,iVar4),
            (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),i_00);
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    dVar2 = getBuffer((FIR *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),i_00);
    dVar3 = getCoeff((FIR *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),i_00);
    local_18 = dVar2 * dVar3 + local_18;
  }
  return local_18;
}

Assistant:

double FIR::filter(double x){

	double output=0.0;
	
	int M = this->getTaps();

	for (int i=M-1; i>0; i--){this->setBuffer(this->getBuffer(i-1),i);}
	
	this->setBuffer(x,0);
	
	for (int i=0; i<M; i++){output+=(this->getBuffer(i))*(this->getCoeff(i));}

	return output;	

}